

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QLayoutItem_*>::QList(QList<QLayoutItem_*> *this,qsizetype size,parameter_type t)

{
  qsizetype in_RDX;
  QPodArrayOps<QLayoutItem_*> *in_RSI;
  QArrayDataPointer<QLayoutItem_*> *in_RDI;
  QArrayDataPointer<QLayoutItem_*> *unaff_retaddr;
  
  QArrayDataPointer<QLayoutItem_*>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,
             (AllocationOption)((ulong)in_RDX >> 0x20));
  if (in_RSI != (QPodArrayOps<QLayoutItem_*> *)0x0) {
    QArrayDataPointer<QLayoutItem_*>::operator->(in_RDI);
    QtPrivate::QPodArrayOps<QLayoutItem_*>::copyAppend(in_RSI,in_RDX,(parameter_type)in_RDI);
  }
  return;
}

Assistant:

QList(qsizetype size, parameter_type t)
        : d(size)
    {
        if (size)
            d->copyAppend(size, t);
    }